

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O3

DdNode * extraBddSpaceFromFunctionNeg(DdManager *dd,DdNode *bF)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *f;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *pDVar4;
  DdNode *pDVar5;
  
  pDVar4 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar4->index == 0x7fffffff) {
    return (DdNode *)((ulong)dd->one ^ 1);
  }
  pDVar2 = cuddCacheLookup1(dd,extraBddSpaceFromFunctionNeg,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = (pDVar4->type).kids.E;
  if (pDVar4 == bF) {
    pDVar5 = (pDVar4->type).kids.T;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
    pDVar5 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
  }
  f = extraBddSpaceFromFunctionNeg(dd,pDVar2);
  if (f == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar3 = extraBddSpaceFromFunctionNeg(dd,pDVar5);
  if (pDVar3 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    n = cuddBddAndRecur(dd,f,pDVar3);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,f);
      f = pDVar3;
    }
    else {
      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,f);
      Cudd_RecursiveDeref(dd,pDVar3);
      pDVar2 = extraBddSpaceFromFunctionPos(dd,pDVar2);
      f = n;
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar5 = extraBddSpaceFromFunctionPos(dd,pDVar5);
        f = pDVar2;
        if (pDVar5 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          f = cuddBddAndRecur(dd,pDVar2,pDVar5);
          if (f == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar2);
            f = pDVar5;
            goto LAB_0080be3d;
          }
          pDVar3 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
          pDVar3->ref = pDVar3->ref + 1;
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,pDVar5);
          pDVar2 = f;
          if (n == f) {
LAB_0080be06:
            piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            pDVar3->ref = pDVar3->ref - 1;
            cuddCacheInsert1(dd,extraBddSpaceFromFunctionNeg,bF,pDVar2);
            return pDVar2;
          }
          if (((ulong)f & 1) == 0) {
            pDVar2 = cuddUniqueInter(dd,pDVar4->index,f,n);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              goto LAB_0080be3d;
            }
            goto LAB_0080be06;
          }
          pDVar2 = cuddUniqueInter(dd,pDVar4->index,pDVar3,(DdNode *)((ulong)n ^ 1));
          if (pDVar2 != (DdNode *)0x0) {
            pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
            goto LAB_0080be06;
          }
        }
        Cudd_RecursiveDeref(dd,n);
      }
    }
  }
LAB_0080be3d:
  Cudd_RecursiveDeref(dd,f);
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraBddSpaceFromFunctionNeg( DdManager * dd, DdNode * bF )
{
    DdNode * bRes, * bFR;
    statLine( dd );

    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return b0;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceFromFunctionNeg, bF)) )
        return bRes;
    else
    {
        DdNode * bF0,   * bF1;
        DdNode * bPos0, * bPos1;
        DdNode * bNeg0, * bNeg1;
        DdNode * bRes0, * bRes1; 

        if ( bFR != bF ) // bF is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }


        bPos0  = extraBddSpaceFromFunctionNeg( dd, bF0 );
        if ( bPos0 == NULL )
            return NULL;
        cuddRef( bPos0 );

        bPos1  = extraBddSpaceFromFunctionNeg( dd, bF1 );
        if ( bPos1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            return NULL;
        }
        cuddRef( bPos1 );

        bRes0  = cuddBddAndRecur( dd, bPos0, bPos1 );
        if ( bRes0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            Cudd_RecursiveDeref( dd, bPos1 );
            return NULL;
        }
        cuddRef( bRes0 );
        Cudd_RecursiveDeref( dd, bPos0 );
        Cudd_RecursiveDeref( dd, bPos1 );


        bNeg0  = extraBddSpaceFromFunctionPos( dd, bF0 );
        if ( bNeg0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bNeg0 );

        bNeg1  = extraBddSpaceFromFunctionPos( dd, bF1 );
        if ( bNeg1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            return NULL;
        }
        cuddRef( bNeg1 );

        bRes1  = cuddBddAndRecur( dd, bNeg0, bNeg1 );
        if ( bRes1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            Cudd_RecursiveDeref( dd, bNeg1 );
            return NULL;
        }
        cuddRef( bRes1 );
        Cudd_RecursiveDeref( dd, bNeg0 );
        Cudd_RecursiveDeref( dd, bNeg1 );


        // consider the case when Res0 and Res1 are the same node 
        if ( bRes0 == bRes1 )
            bRes = bRes1;
        // consider the case when Res1 is complemented 
        else if ( Cudd_IsComplement(bRes1) ) 
        {
            bRes = cuddUniqueInter( dd, bFR->index, Cudd_Not(bRes1), Cudd_Not(bRes0) );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
            bRes = Cudd_Not(bRes);
        } 
        else 
        {
            bRes = cuddUniqueInter( dd, bFR->index, bRes1, bRes0 );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
        }
        cuddDeref( bRes0 );
        cuddDeref( bRes1 );

        cuddCacheInsert1( dd, extraBddSpaceFromFunctionNeg, bF, bRes );
        return bRes;
    }
}